

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Samba.cpp
# Opt level: O2

uint32_t __thiscall Samba::readWord(Samba *this,uint32_t addr)

{
  SerialPort *pSVar1;
  int iVar2;
  uint32_t uVar3;
  undefined8 *puVar4;
  uint8_t cmd [13];
  
  snprintf((char *)cmd,0xd,"w%08X,4#",addr);
  pSVar1 = (this->_port)._M_t.super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>.
           _M_t.super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
           super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
  iVar2 = (*pSVar1->_vptr_SerialPort[6])(pSVar1,cmd,0xc);
  if (iVar2 == 0xc) {
    pSVar1 = (this->_port)._M_t.super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>.
             _M_t.super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
             super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
    iVar2 = (*pSVar1->_vptr_SerialPort[5])(pSVar1,cmd,4);
    if (iVar2 == 4) {
      if (this->_debug == true) {
        printf("%s(addr=%#x)=%#x\n","readWord",addr,(ulong)(uint)cmd._0_4_);
      }
      uVar3._0_1_ = cmd[0];
      uVar3._1_1_ = cmd[1];
      uVar3._2_1_ = cmd[2];
      uVar3._3_1_ = cmd[3];
      return uVar3;
    }
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar4 = &PTR__exception_001175a0;
  __cxa_throw(puVar4,&SambaError::typeinfo,std::exception::~exception);
}

Assistant:

uint32_t
Samba::readWord(uint32_t addr)
{
    uint8_t cmd[13];
    uint32_t value;

    snprintf((char*) cmd, sizeof(cmd), "w%08X,4#", addr);
    if (_port->write(cmd, sizeof(cmd) - 1) != sizeof(cmd) - 1)
        throw SambaError();
    if (_port->read(cmd, sizeof(uint32_t)) != sizeof(uint32_t))
        throw SambaError();

    value = (cmd[3] << 24 | cmd[2] << 16 | cmd[1] << 8 | cmd[0] << 0);

    if (_debug)
        printf("%s(addr=%#x)=%#x\n", __FUNCTION__, addr, value);

    return value;
}